

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O3

void __thiscall icu_63::RegexMatcher::IncrementTime(RegexMatcher *this,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode UVar2;
  int iVar3;
  
  this->fTickCounter = 10000;
  iVar3 = this->fTime + 1;
  this->fTime = iVar3;
  if (this->fCallbackFn != (URegexMatchCallback *)0x0) {
    UVar1 = (*this->fCallbackFn)(this->fCallbackContext,iVar3);
    if (UVar1 == '\0') {
      UVar2 = U_REGEX_STOPPED_BY_CALLER;
      goto LAB_0016795d;
    }
    iVar3 = this->fTime;
  }
  if (this->fTimeLimit < 1) {
    return;
  }
  UVar2 = U_REGEX_TIME_OUT;
  if (iVar3 < this->fTimeLimit) {
    return;
  }
LAB_0016795d:
  *status = UVar2;
  return;
}

Assistant:

void RegexMatcher::IncrementTime(UErrorCode &status) {
    fTickCounter = TIMER_INITIAL_VALUE;
    fTime++;
    if (fCallbackFn != NULL) {
        if ((*fCallbackFn)(fCallbackContext, fTime) == FALSE) {
            status = U_REGEX_STOPPED_BY_CALLER;
            return;
        }
    }
    if (fTimeLimit > 0 && fTime >= fTimeLimit) {
        status = U_REGEX_TIME_OUT;
    }
}